

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestRunScriptCommand.h
# Opt level: O2

cmCommand * __thiscall cmCTestRunScriptCommand::Clone(cmCTestRunScriptCommand *this)

{
  cmMakefile *pcVar1;
  cmCommand *this_00;
  
  this_00 = (cmCommand *)operator_new(0x60);
  cmCTestRunScriptCommand((cmCTestRunScriptCommand *)this_00);
  pcVar1 = (cmMakefile *)(this->super_cmCTestCommand).CTestScriptHandler;
  this_00[1].super_cmObject._vptr_cmObject = (_func_int **)(this->super_cmCTestCommand).CTest;
  this_00[1].Makefile = pcVar1;
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    cmCTestRunScriptCommand* ni = new cmCTestRunScriptCommand;
    ni->CTest = this->CTest;
    ni->CTestScriptHandler = this->CTestScriptHandler;
    return ni;
    }